

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O3

void png_read_sig(png_structrp png_ptr,png_inforp info_ptr)

{
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  char *error_message;
  ulong start;
  
  bVar2 = png_ptr->sig_bytes;
  start = (ulong)bVar2;
  if (7 < start) {
    return;
  }
  png_ptr->io_state = 0x11;
  png_read_data(png_ptr,info_ptr->signature + start,8 - start);
  png_ptr->sig_bytes = '\b';
  iVar3 = png_sig_cmp(info_ptr->signature,start,8 - start);
  if (iVar3 != 0) {
    if ((bVar2 < 4) && (iVar3 = png_sig_cmp(info_ptr->signature,start,4 - start), iVar3 != 0)) {
      error_message = "Not a PNG file";
    }
    else {
      error_message = "PNG file corrupted by ASCII conversion";
    }
    png_error(png_ptr,error_message);
  }
  if (2 < bVar2) {
    return;
  }
  pbVar1 = (byte *)((long)&png_ptr->mode + 1);
  *pbVar1 = *pbVar1 | 0x10;
  return;
}

Assistant:

void /* PRIVATE */
png_read_sig(png_structrp png_ptr, png_inforp info_ptr)
{
   png_size_t num_checked, num_to_check;

   /* Exit if the user application does not expect a signature. */
   if (png_ptr->sig_bytes >= 8)
      return;

   num_checked = png_ptr->sig_bytes;
   num_to_check = 8 - num_checked;

#ifdef PNG_IO_STATE_SUPPORTED
   png_ptr->io_state = PNG_IO_READING | PNG_IO_SIGNATURE;
#endif

   /* The signature must be serialized in a single I/O call. */
   png_read_data(png_ptr, &(info_ptr->signature[num_checked]), num_to_check);
   png_ptr->sig_bytes = 8;

   if (png_sig_cmp(info_ptr->signature, num_checked, num_to_check) != 0)
   {
      if (num_checked < 4 &&
          png_sig_cmp(info_ptr->signature, num_checked, num_to_check - 4))
         png_error(png_ptr, "Not a PNG file");
      else
         png_error(png_ptr, "PNG file corrupted by ASCII conversion");
   }
   if (num_checked < 3)
      png_ptr->mode |= PNG_HAVE_PNG_SIGNATURE;
}